

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

Client * __thiscall
kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++:240:17)>
::operator()(Client *__return_storage_ptr__,
            Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_membrane_test_c__:240:17)>
            *this)

{
  Own<capnp::MembranePolicy,_std::nullptr_t> *in_R9;
  Orphanage OVar1;
  Orphanage to;
  Own<capnp::MembranePolicy,_std::nullptr_t> OStack_288;
  Builder local_278;
  OrphanBuilder local_248;
  Builder root;
  MallocMessageBuilder insideBuilder;
  MallocMessageBuilder outsideBuilder;
  
  capnp::MallocMessageBuilder::MallocMessageBuilder(&outsideBuilder,0x400,GROW_HEURISTICALLY);
  capnp::MessageBuilder::initRoot<capnproto_test::capnp::test::TestContainMembrane>
            (&root,&outsideBuilder.super_MessageBuilder);
  heap<capnp::_::(anonymous_namespace)::ThingImpl,char_const(&)[7]>((char (*) [7])&local_278);
  capnproto_test::capnp::test::TestMembrane::Thing::Client::
  Client<capnp::_::(anonymous_namespace)::ThingImpl,void>
            ((Client *)&insideBuilder,
             (Own<capnp::_::(anonymous_namespace)::ThingImpl,_std::nullptr_t> *)&local_278);
  capnproto_test::capnp::test::TestContainMembrane::Builder::setCap(&root,(Client *)&insideBuilder);
  Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)insideBuilder.super_MessageBuilder.arenaSpace
            );
  Own<capnp::_::(anonymous_namespace)::ThingImpl,_std::nullptr_t>::~Own
            ((Own<capnp::_::(anonymous_namespace)::ThingImpl,_std::nullptr_t> *)&local_278);
  capnp::MallocMessageBuilder::MallocMessageBuilder(&insideBuilder,0x400,GROW_HEURISTICALLY);
  capnp::_::StructBuilder::asReader(&root._builder);
  OVar1 = capnp::MessageBuilder::getOrphanage(&insideBuilder.super_MessageBuilder);
  (*(((((this->f).env)->policy).ptr)->super_MembranePolicy)._vptr_MembranePolicy[2])(&OStack_288);
  to.capTable = (CapTableBuilder *)&OStack_288;
  to.arena = (BuilderArena *)OVar1.capTable;
  capnp::copyOutOfMembrane<capnproto_test::capnp::test::TestContainMembrane::Reader>
            ((Orphan<capnproto_test::capnp::test::TestContainMembrane> *)&local_248,
             (capnp *)&local_278,(Reader *)OVar1.arena,to,in_R9);
  capnp::MessageBuilder::adoptRoot<capnproto_test::capnp::test::TestContainMembrane>
            (&insideBuilder.super_MessageBuilder,
             (Orphan<capnproto_test::capnp::test::TestContainMembrane> *)&local_248);
  capnp::_::OrphanBuilder::~OrphanBuilder(&local_248);
  Own<capnp::MembranePolicy,_std::nullptr_t>::dispose(&OStack_288);
  capnp::MessageBuilder::getRoot<capnproto_test::capnp::test::TestContainMembrane>
            (&local_278,&insideBuilder.super_MessageBuilder);
  capnproto_test::capnp::test::TestContainMembrane::Builder::getCap
            (__return_storage_ptr__,&local_278);
  capnp::MallocMessageBuilder::~MallocMessageBuilder(&insideBuilder);
  capnp::MallocMessageBuilder::~MallocMessageBuilder(&outsideBuilder);
  return __return_storage_ptr__;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }